

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# econ.cpp
# Opt level: O1

int CEcon::NewClientCallback(int ClientID,void *pUser)

{
  int64 iVar1;
  long lVar2;
  long in_FS_OFFSET;
  char aBuf [128];
  char aAddrStr [48];
  char acStack_e8 [128];
  char local_68 [56];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (long)ClientID;
  net_addr_str((NETADDR *)((long)pUser + lVar2 * 0x6a8 + 0x94),local_68,0x30,1);
  str_format(acStack_e8,0x80,"client accepted. cid=%d addr=%s\'",(ulong)(uint)ClientID,local_68);
  (**(code **)(**(long **)((long)pUser + 0x68) + 200))
            (*(long **)((long)pUser + 0x68),1,"econ",acStack_e8,0);
  *(undefined4 *)((long)pUser + lVar2 * 0x18) = 1;
  iVar1 = time_get();
  *(int64 *)((long)pUser + lVar2 * 0x18 + 8) = iVar1;
  *(undefined4 *)((long)pUser + lVar2 * 0x18 + 0x10) = 0;
  CNetConsole::Send((CNetConsole *)((long)pUser + 0x78),ClientID,"Enter password:");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int CEcon::NewClientCallback(int ClientID, void *pUser)
{
	CEcon *pThis = (CEcon *)pUser;

	char aAddrStr[NETADDR_MAXSTRSIZE];
	net_addr_str(pThis->m_NetConsole.ClientAddr(ClientID), aAddrStr, sizeof(aAddrStr), true);
	char aBuf[128];
	str_format(aBuf, sizeof(aBuf), "client accepted. cid=%d addr=%s'", ClientID, aAddrStr);
	pThis->Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "econ", aBuf);

	pThis->m_aClients[ClientID].m_State = CClient::STATE_CONNECTED;
	pThis->m_aClients[ClientID].m_TimeConnected = time_get();
	pThis->m_aClients[ClientID].m_AuthTries = 0;

	pThis->m_NetConsole.Send(ClientID, "Enter password:");
	return 0;
}